

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall google::protobuf::RepeatedField<int>::~RepeatedField(RepeatedField<int> *this)

{
  Arena *this_00;
  Rep *rep;
  Arena *arena;
  RepeatedField<int> *this_local;
  
  this_00 = GetArena(this);
  if (this_00 != (Arena *)0x0) {
    Arena::SpaceAllocated(this_00);
  }
  if (0 < this->total_size_) {
    rep = RepeatedField<int>::rep(this);
    InternalDeallocate(this,rep,this->total_size_);
  }
  return;
}

Assistant:

RepeatedField<Element>::~RepeatedField() {
#ifndef NDEBUG
  // Try to trigger segfault / asan failure in non-opt builds. If arena_
  // lifetime has ended before the destructor.
  auto arena = GetArena();
  if (arena) (void)arena->SpaceAllocated();
#endif
  if (total_size_ > 0) {
    InternalDeallocate(rep(), total_size_);
  }
}